

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O3

void riscv_cpu_set_virt_enabled_riscv64(CPURISCVState_conflict1 *env,_Bool enable)

{
  ulong uVar1;
  CPURISCVState_conflict1 *__mptr;
  
  if ((env->misa & 0x80) != 0) {
    uVar1 = env->virt;
    if ((_Bool)((byte)uVar1 & 1) != enable) {
      tlb_flush_riscv64((CPUState *)&env[-0x18].pmp_state.num_rules);
      uVar1 = env->virt;
    }
    env->virt = uVar1 & 0xfffffffffffffffe | (ulong)enable;
  }
  return;
}

Assistant:

void riscv_cpu_set_virt_enabled(CPURISCVState *env, bool enable)
{
    if (!riscv_has_ext(env, RVH)) {
        return;
    }

    /* Flush the TLB on all virt mode changes. */
    if (get_field(env->virt, VIRT_ONOFF) != enable) {
        tlb_flush(env_cpu(env));
    }

    env->virt = set_field(env->virt, VIRT_ONOFF, enable);
}